

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::ReleaseMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  int iVar1;
  Message *pMVar2;
  Arena *pAVar3;
  undefined4 extraout_var;
  Message *copy_from_arena;
  Message *released;
  MessageFactory *factory_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pMVar2 = UnsafeArenaReleaseMessage(this,message,field,factory);
  pAVar3 = GetArena(this,message);
  copy_from_arena = pMVar2;
  if ((pAVar3 != (Arena *)0x0) && (pMVar2 != (Message *)0x0)) {
    iVar1 = (*(pMVar2->super_MessageLite)._vptr_MessageLite[3])();
    copy_from_arena = (Message *)CONCAT44(extraout_var,iVar1);
    (*(copy_from_arena->super_MessageLite)._vptr_MessageLite[0x11])(copy_from_arena,pMVar2);
  }
  return copy_from_arena;
}

Assistant:

Message* GeneratedMessageReflection::ReleaseMessage(
    Message* message,
    const FieldDescriptor* field,
    MessageFactory* factory) const {
  Message* released = UnsafeArenaReleaseMessage(message, field, factory);
  if (GetArena(message) != NULL && released != NULL) {
    Message* copy_from_arena = released->New();
    copy_from_arena->CopyFrom(*released);
    released = copy_from_arena;
  }
  return released;
}